

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall BRTS_XZ<UFPC>::PerformLabeling(BRTS_XZ<UFPC> *this)

{
  ushort uVar1;
  uint height;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Mat1b *pMVar5;
  int *piVar6;
  Mat1i *pMVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  Run *pRVar11;
  int iVar12;
  uint64_t *puVar13;
  Run *pRVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long local_d0;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  height = *(uint *)&pMVar5->field_0x8;
  uVar2 = *(uint *)&pMVar5->field_0xc;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar2;
  uVar18 = uVar2 + 0x3f;
  if (-1 < (int)uVar2) {
    uVar18 = uVar2;
  }
  iVar12 = ((int)uVar18 >> 6) + 1;
  (this->data_compressed).data_width = iVar12;
  iVar12 = iVar12 * height;
  uVar17 = 0xffffffffffffffff;
  if (-1 < iVar12) {
    uVar17 = (long)iVar12 * 8;
  }
  puVar13 = (uint64_t *)operator_new__(uVar17);
  (this->data_compressed).bits = puVar13;
  InitCompressedData(this,&this->data_compressed);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar2;
  pRVar14 = (Run *)operator_new__((ulong)(((uVar2 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar14;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar12 = *(int *)&pMVar5->field_0x8;
  iVar3 = *(int *)&pMVar5->field_0xc;
  UFPC::P_ = (uint *)operator_new__((ulong)(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                                            ((iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,pRVar14);
  pRVar14 = (this->data_runs).runs;
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar6,piVar6[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  if (0 < (int)height) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar8 = *(long *)&pMVar7->field_0x10;
    lVar9 = **(long **)&pMVar7->field_0x48;
    uVar17 = 0;
    local_d0 = lVar8;
    do {
      puVar10 = UFPC::P_;
      lVar15 = lVar9 * uVar17 + lVar8;
      uVar18 = 0;
      pRVar11 = pRVar14;
      do {
        pRVar14 = pRVar11;
        uVar19 = (uint)pRVar14->start_pos;
        if (pRVar14->start_pos == 0xffff) {
          if ((int)uVar18 < (int)uVar2) {
            memset((void *)(lVar15 + (long)(int)uVar18 * 4),0,(ulong)(~uVar18 + uVar2) * 4 + 4);
            uVar18 = uVar2;
          }
          pRVar14 = pRVar14 + 1;
        }
        else {
          uVar1 = pRVar14->end_pos;
          uVar4 = puVar10[pRVar14->label];
          if ((int)uVar18 < (int)uVar19) {
            memset((void *)(lVar15 + (long)(int)uVar18 * 4),0,(ulong)(~uVar18 + uVar19) * 4 + 4);
            lVar16 = 0;
            do {
              lVar16 = lVar16 + -1;
            } while ((long)(int)uVar18 - (ulong)uVar19 != lVar16);
            uVar18 = uVar18 - (int)lVar16;
          }
          if ((int)uVar18 < (int)(uint)uVar1) {
            lVar16 = 0;
            do {
              *(uint *)(local_d0 + (long)(int)uVar18 * 4 + lVar16 * 4) = uVar4;
              lVar16 = lVar16 + 1;
            } while ((ulong)uVar1 - (long)(int)uVar18 != lVar16);
            uVar18 = uVar18 + (int)lVar16;
          }
        }
        pRVar11 = pRVar14 + 1;
      } while (uVar19 != 0xffff);
      uVar17 = uVar17 + 1;
      local_d0 = local_d0 + lVar9;
    } while (uVar17 != height);
  }
  if (UFPC::P_ != (uint *)0x0) {
    operator_delete__(UFPC::P_);
  }
  pRVar14 = (this->data_runs).runs;
  if (pRVar14 != (Run *)0x0) {
    operator_delete__(pRVar14);
  }
  puVar13 = (this->data_compressed).bits;
  if (puVar13 != (uint64_t *)0x0) {
    operator_delete__(puVar13);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size());
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }